

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O0

bool __thiscall pjson::value_variant::convert_to_bool(value_variant *this,bool *val,bool def)

{
  json_value_type_t jVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  bool def_local;
  bool *val_local;
  value_variant *this_local;
  
  jVar1 = (this->super_value_variant_data).m_type;
  if (jVar1 - cJSONValueTypeBool < 2) {
    *val = (this->super_value_variant_data).m_data.m_object.m_p != (key_value_t *)0x0;
    this_local._7_1_ = true;
  }
  else if (jVar1 == cJSONValueTypeDouble) {
    *val = (this->super_value_variant_data).m_data.m_flVal != 0.0;
    this_local._7_1_ = true;
  }
  else if (jVar1 == cJSONValueTypeString) {
    pcVar3 = value_variant_data::get_string_ptr(&this->super_value_variant_data);
    iVar2 = pjson_stricmp(pcVar3,"false");
    if (iVar2 == 0) {
      *val = false;
      this_local._7_1_ = true;
    }
    else {
      pcVar3 = value_variant_data::get_string_ptr(&this->super_value_variant_data);
      iVar2 = pjson_stricmp(pcVar3,"true");
      if (iVar2 == 0) {
        *val = true;
        this_local._7_1_ = true;
      }
      else {
        pcVar3 = value_variant_data::get_string_ptr(&this->super_value_variant_data);
        dVar4 = atof(pcVar3);
        *val = dVar4 != 0.0;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    *val = def;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool convert_to_bool(bool& val, bool def) const
      {
         switch (m_type)
         {
            case cJSONValueTypeBool:
            case cJSONValueTypeInt:
            {
               val = (m_data.m_nVal != 0);
               return true;
            }
            case cJSONValueTypeDouble:
            {
               val = (m_data.m_flVal != 0);
               return true;
            }
            case cJSONValueTypeString:
            {
               if (!pjson_stricmp(get_string_ptr(), "false"))
               {
                  val = false;
                  return true;
               }
               else if (!pjson_stricmp(get_string_ptr(), "true"))
               {
                  val = true;
                  return true;
               }
               val = (atof(get_string_ptr()) != 0.0f);
               return true;
            }
            default:
               break;
         }
         val = def;
         return false;
      }